

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O2

string * __thiscall
soul::Type::getShortIdentifierDescription_abi_cxx11_(string *__return_storage_ptr__,Type *this)

{
  Category CVar1;
  BoundedIntSize BVar2;
  ArraySize AVar3;
  char *pcVar4;
  Structure *pSVar5;
  string *this_00;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  Type local_50;
  string local_38;
  
  if (this->isConstant == true) {
    removeConst((Type *)local_90,this);
    getShortIdentifierDescription_abi_cxx11_(&local_b0,(Type *)local_90);
    std::operator+(__return_storage_ptr__,"const_",&local_b0);
LAB_0020a00d:
    std::__cxx11::string::~string((string *)&local_b0);
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)(local_90 + 0x10));
    return __return_storage_ptr__;
  }
  if (this->isRef == true) {
    removeReference((Type *)local_90,this);
    getShortIdentifierDescription_abi_cxx11_(&local_b0,(Type *)local_90);
    std::operator+(__return_storage_ptr__,"ref_",&local_b0);
    goto LAB_0020a00d;
  }
  CVar1 = this->category;
  if (CVar1 == vector) {
    AVar3 = getVectorSize(this);
    std::__cxx11::to_string(&local_70,AVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   "vec_",&local_70);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,"_"
                  );
    pcVar4 = PrimitiveType::getShortIdentifierDescription(&this->primitiveType);
    std::operator+(__return_storage_ptr__,&local_b0,pcVar4);
LAB_0020a09c:
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)local_90);
    this_00 = &local_70;
    goto LAB_0020a0b5;
  }
  if ((CVar1 == array) && (this->boundingSize == 0)) {
    getArrayElementType((Type *)local_90,this);
    getShortIdentifierDescription_abi_cxx11_(&local_b0,(Type *)local_90);
    std::operator+(__return_storage_ptr__,"slice_",&local_b0);
    goto LAB_0020a00d;
  }
  if (CVar1 == array) {
    AVar3 = getArraySize(this);
    std::__cxx11::to_string(&local_70,AVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   "arr_",&local_70);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,"_"
                  );
    getArrayElementType(&local_50,this);
    getShortIdentifierDescription_abi_cxx11_(&local_38,&local_50);
    std::operator+(__return_storage_ptr__,&local_b0,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_50.structure);
    goto LAB_0020a09c;
  }
  switch(CVar1) {
  case wrap:
    BVar2 = getBoundedIntLimit(this);
    std::__cxx11::to_string(&local_b0,BVar2);
    std::operator+(__return_storage_ptr__,"wrap_",&local_b0);
    break;
  case clamp:
    BVar2 = getBoundedIntLimit(this);
    std::__cxx11::to_string(&local_b0,BVar2);
    std::operator+(__return_storage_ptr__,"clamp_",&local_b0);
    break;
  case structure:
    pSVar5 = getStructRef(this);
    std::operator+(__return_storage_ptr__,"struct_",&pSVar5->name);
    return __return_storage_ptr__;
  case stringLiteral:
    pcVar4 = "string";
    goto LAB_0020a261;
  default:
    pcVar4 = PrimitiveType::getShortIdentifierDescription(&this->primitiveType);
LAB_0020a261:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar4,(allocator<char> *)&local_b0);
    return __return_storage_ptr__;
  }
  this_00 = &local_b0;
LAB_0020a0b5:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string Type::getShortIdentifierDescription() const
{
    if (isConst())          return "const_" + removeConst().getShortIdentifierDescription();
    if (isReference())      return "ref_" + removeReference().getShortIdentifierDescription();
    if (isVector())         return "vec_" + std::to_string (getVectorSize()) + "_" + primitiveType.getShortIdentifierDescription();
    if (isUnsizedArray())   return "slice_" + getArrayElementType().getShortIdentifierDescription();
    if (isArray())          return "arr_" + std::to_string (getArraySize()) + "_" + getArrayElementType().getShortIdentifierDescription();
    if (isWrapped())        return "wrap_" + std::to_string (getBoundedIntLimit());
    if (isClamped())        return "clamp_" + std::to_string (getBoundedIntLimit());
    if (isStruct())         return "struct_" + getStructRef().getName();
    if (isStringLiteral())  return "string";

    return primitiveType.getShortIdentifierDescription();
}